

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint * Kit_DsdTruthCompute(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk)

{
  ushort uVar1;
  int iVar2;
  uint *puVar3;
  uint *pIn;
  uint i;
  
  uVar1 = pNtk->nVars;
  if ((int)(uint)uVar1 <= p->nVars) {
    for (i = 0; i < uVar1; i = i + 1) {
      puVar3 = (uint *)Vec_PtrEntry(p->vTtNodes,i);
      pIn = (uint *)Vec_PtrEntry(p->vTtElems,i);
      Kit_TruthCopy(puVar3,pIn,p->nVars);
      uVar1 = pNtk->nVars;
    }
    iVar2 = Abc_Lit2Var((uint)pNtk->Root);
    puVar3 = Kit_DsdTruthComputeNode_rec(p,pNtk,iVar2);
    iVar2 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar2 != 0) {
      Kit_TruthNot(puVar3,puVar3,(uint)pNtk->nVars);
    }
    return puVar3;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x29d,"unsigned int *Kit_DsdTruthCompute(Kit_DsdMan_t *, Kit_DsdNtk_t *)");
}

Assistant:

unsigned * Kit_DsdTruthCompute( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk )
{
    unsigned * pTruthRes;
    int i;
    // assign elementary truth ables
    assert( pNtk->nVars <= p->nVars );
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNode_rec( p, pNtk, Abc_Lit2Var(pNtk->Root) );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}